

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManCutMatchOne(Nf_Man_t *p,int iObj,int *pCut,int *pCutSet)

{
  float fVar1;
  int iVar2;
  int iVar3;
  Nf_Obj_t *pNVar4;
  Vec_Wec_t *p_00;
  Mio_Cell2_t *pMVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Vec_Int_t *p_01;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  Nf_Obj_t *pBestF [6];
  long alStack_68 [7];
  
  pNVar4 = p->pNfObjs;
  uVar16 = *pCut;
  uVar18 = uVar16 & 0x1f;
  uVar12 = uVar16 >> 5;
  uVar6 = Abc_LitIsCompl(uVar12);
  p_00 = p->vTt2Match;
  iVar7 = Abc_Lit2Var(uVar12);
  p_01 = Vec_WecEntry(p_00,iVar7);
  for (uVar10 = 0; uVar18 != uVar10; uVar10 = uVar10 + 1) {
    alStack_68[uVar10] = (long)(p->pNfObjs + pCut[uVar10 + 1]);
  }
  lVar19 = (long)iObj * 0x40;
  if (uVar18 == 0) {
    if (0x3f < uVar16) {
      __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x45a,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
    }
    for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
      pNVar4 = p->pNfObjs;
      *(undefined4 *)((long)&pNVar4->M[0][1].D + lVar19) = 0;
      *(undefined4 *)((long)&pNVar4->M[0][0].D + lVar19) = 0;
      uVar18 = (uint)lVar15 ^ (uint)(uVar12 == 1);
      fVar21 = p->pCells[uVar18].AreaF;
      *(float *)((long)&pNVar4->M[0][1].F + lVar19) = fVar21;
      *(float *)((long)&pNVar4->M[0][0].F + lVar19) = fVar21;
      uVar16 = Nf_CutHandle(pCutSet,pCut);
      uVar6 = (uVar16 & 0x3ff) << 0x14;
      uVar16 = *(uint *)(&pNVar4->M[0][0].field_0x0 + lVar19);
      *(uint *)(&pNVar4->M[0][1].field_0x0 + lVar19) =
           *(uint *)(&pNVar4->M[0][1].field_0x0 + lVar19) & 0xc0000000 | uVar6 | uVar18;
      *(uint *)(&pNVar4->M[0][0].field_0x0 + lVar19) = uVar16 & 0xc0000000 | uVar6 | uVar18;
      *(undefined4 *)(&pNVar4->M[0][1].Cfg.field_0x0 + lVar19) = 0;
      *(undefined4 *)(&pNVar4->M[0][0].Cfg.field_0x0 + lVar19) = 0;
      lVar19 = lVar19 + 0x20;
    }
  }
  else {
    for (uVar16 = 0; (int)(uVar16 | 1) < p_01->nSize; uVar16 = uVar16 + 2) {
      iVar7 = Vec_IntEntry(p_01,uVar16);
      uVar12 = Vec_IntEntry(p_01,uVar16 | 1);
      pMVar5 = p->pCells;
      uVar13 = uVar12 & 1 ^ uVar6;
      iVar8 = Nf_ObjRequired(p,iObj,uVar13);
      if (uVar18 != *(uint *)&pMVar5[iVar7].field_0x10 >> 0x1c) {
        __assert_fail("nFans == (int)pC->nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x472,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
      }
      puVar14 = (uint *)(&pNVar4[iObj].M[0][0].field_0x0 + (uVar13 << 5));
      bVar11 = 0;
      uVar13 = 0;
      fVar21 = pMVar5[iVar7].AreaF;
      for (uVar10 = 0; uVar18 != uVar10; uVar10 = uVar10 + 1) {
        bVar20 = ((uVar12 >> 1 & 0x7f) >> ((uint)uVar10 & 0x1f) & 1) != 0;
        lVar19 = alStack_68[(uVar12 >> 8) >> (bVar11 & 0x1f) & 0xf];
        iVar2 = pMVar5[iVar7].iDelays[uVar10];
        iVar3 = *(int *)(lVar19 + 8 + (ulong)bVar20 * 0x20);
        if ((iVar8 == 0x3fffffff) ||
           (uVar17 = *(int *)(lVar19 + 0x18 + (ulong)bVar20 * 0x20) + iVar2, iVar8 < (int)uVar17)) {
          if (((int)puVar14[2] < 0x3fffffff) &&
             (((int)puVar14[6] < 0x3fffffff && (iVar8 < iVar2 + iVar3)))) goto LAB_006056e9;
          uVar17 = iVar2 + iVar3;
          if ((int)uVar17 < (int)uVar13) {
            uVar17 = uVar13;
          }
          fVar22 = 1e+32;
          uVar13 = uVar17;
          if ((fVar21 < 1e+32) &&
             (fVar1 = *(float *)(lVar19 + 0xc + (ulong)bVar20 * 0x20), fVar1 < 1e+32)) {
            fVar22 = fVar21 + fVar1;
          }
        }
        else {
          if ((int)uVar17 < (int)uVar13) {
            uVar17 = uVar13;
          }
          fVar22 = fVar21 + *(float *)(lVar19 + 0x1c + (ulong)bVar20 * 0x20);
          uVar13 = uVar17;
        }
        bVar11 = bVar11 + 4;
        fVar21 = fVar22;
      }
      if ((int)uVar13 < (int)puVar14[2]) {
        puVar14[2] = uVar13;
        puVar14[3] = (uint)fVar21;
        uVar17 = Nf_CutHandle(pCutSet,pCut);
        uVar9 = (uVar17 & 0x3ff) << 0x14;
        uVar17 = *puVar14;
        *puVar14 = uVar17 & 0xc00fffff | uVar9;
        *puVar14 = uVar17 & 0xc0000000 | uVar9 | *(uint *)&pMVar5[iVar7].field_0x10 & 0xfffff;
        puVar14[1] = uVar12 & 0xfffffffe;
      }
      if (fVar21 + 0.001 < (float)puVar14[7]) {
        puVar14[6] = uVar13;
        puVar14[7] = (uint)fVar21;
        uVar13 = Nf_CutHandle(pCutSet,pCut);
        uVar17 = (uVar13 & 0x3ff) << 0x14;
        uVar13 = puVar14[4];
        puVar14[4] = uVar13 & 0xc00fffff | uVar17;
        puVar14[4] = uVar13 & 0xc0000000 | uVar17 | *(uint *)&pMVar5[iVar7].field_0x10 & 0xfffff;
        puVar14[5] = uVar12 & 0xfffffffe;
      }
LAB_006056e9:
    }
  }
  return;
}

Assistant:

void Nf_ManCutMatchOne( Nf_Man_t * p, int iObj, int * pCut, int * pCutSet )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, c, Info, Offset, iFanin, fComplF;
    int ArrivalD, ArrivalA;
    Nf_Mat_t * pD, * pA;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        assert( iFuncLit == 0 || iFuncLit == 1 );
        for ( c = 0; c < 2; c++ )
        { 
            pD = Nf_ObjMatchD( p, iObj, c );
            pA = Nf_ObjMatchA( p, iObj, c );
            pD->D = pA->D = 0;
            pD->F = pA->F = p->pCells[c ^ Const].AreaF;
            pD->CutH = pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pA->Gate = c ^ Const;
//            pD->Conf = pA->Conf = 0;
            pD->Cfg = pA->Cfg = Nf_Int2Cfg(0);
        }
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        int Required   = Nf_ObjRequired( p, iObj, fCompl ), Delay = 0;
        Nf_Mat_t * pD  = &pBest->M[fCompl][0];
        Nf_Mat_t * pA  = &pBest->M[fCompl][1];
        float AreaF    = pC->AreaF;
        assert( nFans == (int)pC->nFanins );
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            ArrivalD  = pBestF[iFanin]->M[fComplF][0].D;
            ArrivalA  = pBestF[iFanin]->M[fComplF][1].D;
            if ( ArrivalA + pC->iDelays[k] <= Required && Required != SCL_INFINITY )
            {
                Delay = Abc_MaxInt( Delay, ArrivalA + pC->iDelays[k] );
                AreaF += pBestF[iFanin]->M[fComplF][1].F;
            }
            else 
            {
                if ( pD->D < SCL_INFINITY && pA->D < SCL_INFINITY && ArrivalD + pC->iDelays[k] > Required )
                    break;
                Delay = Abc_MaxInt( Delay, ArrivalD + pC->iDelays[k] );
                //AreaF += pBestF[iFanin]->M[fComplF][0].F;
                if ( AreaF >= (float)1e32 || pBestF[iFanin]->M[fComplF][0].F >= (float)1e32 )
                    AreaF = (float)1e32;
                else 
                    AreaF += pBestF[iFanin]->M[fComplF][0].F;
            }
        }
        if ( k < nFans )
            continue;
        // select best Cfgch
        if ( pD->D > Delay )
        {
            pD->D = Delay;
            pD->F = AreaF;
            pD->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pC->Id;
            pD->Cfg = Cfg;
            pD->Cfg.fCompl = 0;
        }

        if ( pA->F > AreaF + NF_EPSILON )
        {
            pA->D = Delay;
            pA->F = AreaF;
            pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pA->Gate = pC->Id;
            pA->Cfg = Cfg;
            pA->Cfg.fCompl = 0;
        }
    }
}